

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_utils.cpp
# Opt level: O2

void __thiscall spvtools::opt::LoopUtils::CreateLoopDedicatedExits(LoopUtils *this)

{
  Function *f;
  uint *puVar1;
  IRContext *pIVar2;
  uint32_t *puVar3;
  pointer puVar4;
  bool bVar5;
  uint32_t uVar6;
  LoopDescriptor *this_00;
  CFG *this_01;
  DefUseManager *this_02;
  __node_base _Var7;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar8;
  BasicBlock *pBVar9;
  tuple<spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_> this_03;
  BasicBlock *pBVar10;
  iterator instr;
  Loop *this_04;
  Loop *extraout_RAX;
  long lVar11;
  uint32_t *puVar12;
  long lVar13;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  _Var14;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  __it;
  type tVar15;
  BasicBlock *non_dedicate;
  IRContext *local_140;
  uint local_134;
  __uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  local_130;
  InstructionBuilder builder;
  _Head_base<0UL,_spvtools::opt::BasicBlock_*,_false> local_d8;
  _Any_data local_d0;
  code *local_c0;
  code *local_b8;
  UptrVectorIterator<spvtools::opt::BasicBlock,_false> local_b0;
  unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
  new_loop_exits;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  exit_bb_set;
  
  f = this->loop_->loop_header_->function_;
  this_00 = IRContext::GetLoopDescriptor(this->context_,f);
  this_01 = IRContext::cfg(this->context_);
  this_02 = IRContext::get_def_use_mgr(this->context_);
  exit_bb_set._M_h._M_buckets = &exit_bb_set._M_h._M_single_bucket;
  exit_bb_set._M_h._M_bucket_count = 1;
  exit_bb_set._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  exit_bb_set._M_h._M_element_count = 0;
  exit_bb_set._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  exit_bb_set._M_h._M_rehash_policy._M_next_resize = 0;
  exit_bb_set._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_140 = (IRContext *)this;
  Loop::GetExitBlocks(this->loop_,&exit_bb_set);
  new_loop_exits._M_h._M_buckets = &new_loop_exits._M_h._M_single_bucket;
  new_loop_exits._M_h._M_bucket_count = 1;
  new_loop_exits._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  new_loop_exits._M_h._M_element_count = 0;
  new_loop_exits._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  new_loop_exits._M_h._M_rehash_policy._M_next_resize = 0;
  new_loop_exits._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_134 = 0;
  _Var7 = exit_bb_set._M_h._M_before_begin;
  do {
    if (_Var7._M_nxt == (_Hash_node_base *)0x0) {
      if (new_loop_exits._M_h._M_element_count == 1) {
        Loop::SetMergeBlock((Loop *)(local_140->grammar_).operandTable_,
                            (BasicBlock *)new_loop_exits._M_h._M_before_begin._M_nxt[1]._M_nxt);
      }
      if ((local_134 & 1) != 0) {
        IRContext::InvalidateAnalysesExceptFor
                  ((IRContext *)local_140->syntax_context_,
                   kAnalysisLoopAnalysis|kAnalysisCFG|kAnalysisInstrToBlockMapping|kAnalysisBegin);
      }
      std::
      _Hashtable<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::hash<spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable(&new_loop_exits._M_h);
      std::
      _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable(&exit_bb_set._M_h);
      return;
    }
    uVar6 = *(uint32_t *)&_Var7._M_nxt[1]._M_nxt;
    non_dedicate = CFG::block(this_01,uVar6);
    pvVar8 = CFG::preds(this_01,uVar6);
    __it._M_current =
         (pvVar8->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
         super__Vector_impl_data._M_start;
    puVar1 = (pvVar8->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    builder.context_ = local_140;
    lVar11 = (long)puVar1 - (long)__it._M_current;
    for (lVar13 = lVar11 >> 4; _Var14._M_current = __it._M_current, 0 < lVar13; lVar13 = lVar13 + -1
        ) {
      bVar5 = __gnu_cxx::__ops::
              _Iter_negate<spvtools::opt::LoopUtils::CreateLoopDedicatedExits()::$_2>::operator()
                        ((_Iter_negate<spvtools::opt::LoopUtils::CreateLoopDedicatedExits()::__2> *)
                         &builder,__it);
      if (bVar5) goto LAB_00216ffb;
      bVar5 = __gnu_cxx::__ops::
              _Iter_negate<spvtools::opt::LoopUtils::CreateLoopDedicatedExits()::$_2>::operator()
                        ((_Iter_negate<spvtools::opt::LoopUtils::CreateLoopDedicatedExits()::__2> *)
                         &builder,(__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                   )(__it._M_current + 1));
      _Var14._M_current = __it._M_current + 1;
      if (bVar5) goto LAB_00216ffb;
      bVar5 = __gnu_cxx::__ops::
              _Iter_negate<spvtools::opt::LoopUtils::CreateLoopDedicatedExits()::$_2>::operator()
                        ((_Iter_negate<spvtools::opt::LoopUtils::CreateLoopDedicatedExits()::__2> *)
                         &builder,(__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                   )(__it._M_current + 2));
      _Var14._M_current = __it._M_current + 2;
      if (bVar5) goto LAB_00216ffb;
      bVar5 = __gnu_cxx::__ops::
              _Iter_negate<spvtools::opt::LoopUtils::CreateLoopDedicatedExits()::$_2>::operator()
                        ((_Iter_negate<spvtools::opt::LoopUtils::CreateLoopDedicatedExits()::__2> *)
                         &builder,(__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                   )(__it._M_current + 3));
      _Var14._M_current = __it._M_current + 3;
      if (bVar5) goto LAB_00216ffb;
      __it._M_current = __it._M_current + 4;
      lVar11 = lVar11 + -0x10;
    }
    lVar11 = lVar11 >> 2;
    if (lVar11 == 1) {
LAB_00217309:
      bVar5 = __gnu_cxx::__ops::
              _Iter_negate<spvtools::opt::LoopUtils::CreateLoopDedicatedExits()::$_2>::operator()
                        ((_Iter_negate<spvtools::opt::LoopUtils::CreateLoopDedicatedExits()::__2> *)
                         &builder,__it);
      _Var14._M_current = __it._M_current;
      if (!bVar5) {
        _Var14._M_current = puVar1;
      }
LAB_00216ffb:
      if (_Var14._M_current == puVar1) goto LAB_002172c7;
      puVar4 = (f->blocks_).
               super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      do {
        local_b0.iterator_._M_current = puVar4;
        local_b0.container_ = &f->blocks_;
        if (local_b0.iterator_._M_current ==
            (f->blocks_).
            super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          __assert_fail("insert_pt != function->end() && \"Basic Block not found\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_utils.cpp"
                        ,0x15f,"void spvtools::opt::LoopUtils::CreateLoopDedicatedExits()");
        }
        puVar4 = local_b0.iterator_._M_current + 1;
      } while (((local_b0.iterator_._M_current)->_M_t).
               super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
               .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl !=
               non_dedicate);
      pBVar9 = (BasicBlock *)operator_new(0x88);
      this_03.
      super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
      .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl =
           (_Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
            )operator_new(0x70);
      pIVar2 = (IRContext *)local_140->syntax_context_;
      uVar6 = IRContext::TakeNextId(pIVar2);
      builder.context_ = (IRContext *)0x0;
      builder.parent_ = (BasicBlock *)0x0;
      builder.insert_before_.super_iterator.node_ = (iterator)(Instruction *)0x0;
      Instruction::Instruction
                ((Instruction *)
                 this_03.
                 super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                 .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl,pIVar2,
                 OpLabel,0,uVar6,(OperandList *)&builder);
      local_130._M_t.
      super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
      .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl =
           (tuple<spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>)
           (tuple<spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>)
           this_03.
           super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
           .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
      BasicBlock::BasicBlock
                (pBVar9,(unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                         *)&local_130);
      local_d8._M_head_impl = pBVar9;
      tVar15 = UptrVectorIterator<spvtools::opt::BasicBlock,_false>::InsertBefore<false>
                         (&local_b0,(Uptr *)&local_d8);
      pBVar9 = ((tVar15.iterator_._M_current._M_current)->_M_t).
               super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
               .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
      std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>::
      ~unique_ptr((unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                   *)&local_d8);
      if (local_130._M_t.
          super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
          .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl !=
          (_Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
           )0x0) {
        (**(code **)(*(long *)local_130._M_t.
                              super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                              .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>.
                              _M_head_impl + 8))();
      }
      local_130._M_t.
      super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
      .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl =
           (tuple<spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>)
           (_Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
            )0x0;
      std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
                ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)&builder
                );
      pBVar9->function_ = f;
      puVar3 = (pvVar8->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      for (puVar12 = (pvVar8->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                     _M_impl.super__Vector_impl_data._M_start; puVar12 != puVar3;
          puVar12 = puVar12 + 1) {
        uVar6 = *puVar12;
        bVar5 = Loop::IsInsideLoop((Loop *)(local_140->grammar_).operandTable_,uVar6);
        if (bVar5) {
          pBVar10 = CFG::block(this_01,uVar6);
          builder.context_ = (IRContext *)non_dedicate;
          builder._24_8_ =
               std::
               _Function_handler<void_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_utils.cpp:364:43)>
               ::_M_invoke;
          builder.insert_before_.super_iterator.node_ =
               (iterator)
               std::
               _Function_handler<void_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_utils.cpp:364:43)>
               ::_M_manager;
          builder.parent_ = pBVar9;
          BasicBlock::ForEachSuccessorLabel(pBVar10,(function<void_(unsigned_int_*)> *)&builder);
          if (builder.insert_before_.super_iterator.node_ != (Instruction *)0x0) {
            (*(code *)builder.insert_before_.super_iterator.node_)(&builder,&builder,3);
          }
          CFG::RegisterBlock(this_01,pBVar10);
        }
      }
      analysis::DefUseManager::AnalyzeInstDefUse
                (this_02,(pBVar9->label_)._M_t.
                         super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                         .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl);
      pIVar2 = local_140;
      IRContext::set_instr_block
                ((IRContext *)local_140->syntax_context_,
                 (pBVar9->label_)._M_t.
                 super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                 .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl,pBVar9);
      InstructionBuilder::InstructionBuilder
                (&builder,(IRContext *)pIVar2->syntax_context_,pBVar9,
                 kAnalysisInstrToBlockMapping|kAnalysisBegin);
      uVar6 = BasicBlock::id(non_dedicate);
      instr.node_ = InstructionBuilder::AddBranch(&builder,uVar6);
      builder.parent_ = IRContext::get_instr_block(builder.context_,instr.node_);
      pBVar10 = non_dedicate;
      local_d0._8_8_ = 0;
      builder.insert_before_.super_iterator.node_ = (iterator)(iterator)instr.node_;
      local_d0._M_unused._M_object = operator_new(0x20);
      *(InstructionBuilder **)local_d0._M_unused._0_8_ = &builder;
      *(BasicBlock **)((long)local_d0._M_unused._0_8_ + 8) = pBVar9;
      *(DefUseManager **)((long)local_d0._M_unused._0_8_ + 0x10) = this_02;
      *(IRContext **)((long)local_d0._M_unused._0_8_ + 0x18) = pIVar2;
      local_b8 = std::
                 _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_utils.cpp:384:9)>
                 ::_M_invoke;
      local_c0 = std::
                 _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_utils.cpp:384:9)>
                 ::_M_manager;
      BasicBlock::ForEachPhiInst
                (pBVar10,(function<void_(spvtools::opt::Instruction_*)> *)&local_d0,false);
      if (local_c0 != (code *)0x0) {
        (*local_c0)(&local_d0,&local_d0,__destroy_functor);
      }
      CFG::RegisterBlock(this_01,pBVar9);
      uVar6 = BasicBlock::id(non_dedicate);
      CFG::RemoveNonExistingEdges(this_01,uVar6);
      local_d0._M_unused._0_8_ = (undefined8)pBVar9;
      std::__detail::
      _Insert<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::hash<spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
      ::insert((_Insert<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::hash<spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
                *)&new_loop_exits,(value_type *)&local_d0);
      this_04 = LoopDescriptor::operator[](this_00,non_dedicate);
      if (this_04 != (Loop *)0x0) {
        Loop::AddBasicBlock(this_04,pBVar9);
        this_04 = extraout_RAX;
      }
      local_134 = (uint)CONCAT71((int7)((ulong)this_04 >> 8),1);
    }
    else {
      if (lVar11 == 2) {
LAB_002172f1:
        bVar5 = __gnu_cxx::__ops::
                _Iter_negate<spvtools::opt::LoopUtils::CreateLoopDedicatedExits()::$_2>::operator()
                          ((_Iter_negate<spvtools::opt::LoopUtils::CreateLoopDedicatedExits()::__2>
                            *)&builder,__it);
        _Var14._M_current = __it._M_current;
        if (!bVar5) {
          __it._M_current = __it._M_current + 1;
          goto LAB_00217309;
        }
        goto LAB_00216ffb;
      }
      if (lVar11 == 3) {
        bVar5 = __gnu_cxx::__ops::
                _Iter_negate<spvtools::opt::LoopUtils::CreateLoopDedicatedExits()::$_2>::operator()
                          ((_Iter_negate<spvtools::opt::LoopUtils::CreateLoopDedicatedExits()::__2>
                            *)&builder,__it);
        if (!bVar5) {
          __it._M_current = __it._M_current + 1;
          goto LAB_002172f1;
        }
        goto LAB_00216ffb;
      }
LAB_002172c7:
      std::__detail::
      _Insert_base<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::hash<spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::insert((_Insert_base<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::hash<spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                *)&new_loop_exits,&non_dedicate);
    }
    _Var7._M_nxt = (_Var7._M_nxt)->_M_nxt;
  } while( true );
}

Assistant:

void LoopUtils::CreateLoopDedicatedExits() {
  Function* function = loop_->GetHeaderBlock()->GetParent();
  LoopDescriptor& loop_desc = *context_->GetLoopDescriptor(function);
  CFG& cfg = *context_->cfg();
  analysis::DefUseManager* def_use_mgr = context_->get_def_use_mgr();

  const IRContext::Analysis PreservedAnalyses =
      IRContext::kAnalysisDefUse | IRContext::kAnalysisInstrToBlockMapping;

  // Gathers the set of basic block that are not in this loop and have at least
  // one predecessor in the loop and one not in the loop.
  std::unordered_set<uint32_t> exit_bb_set;
  loop_->GetExitBlocks(&exit_bb_set);

  std::unordered_set<BasicBlock*> new_loop_exits;
  bool made_change = false;
  // For each block, we create a new one that gathers all branches from
  // the loop and fall into the block.
  for (uint32_t non_dedicate_id : exit_bb_set) {
    BasicBlock* non_dedicate = cfg.block(non_dedicate_id);
    const std::vector<uint32_t>& bb_pred = cfg.preds(non_dedicate_id);
    // Ignore the block if all the predecessors are in the loop.
    if (std::all_of(bb_pred.begin(), bb_pred.end(),
                    [this](uint32_t id) { return loop_->IsInsideLoop(id); })) {
      new_loop_exits.insert(non_dedicate);
      continue;
    }

    made_change = true;
    Function::iterator insert_pt = function->begin();
    for (; insert_pt != function->end() && &*insert_pt != non_dedicate;
         ++insert_pt) {
    }
    assert(insert_pt != function->end() && "Basic Block not found");

    // Create the dedicate exit basic block.
    // TODO(1841): Handle id overflow.
    BasicBlock& exit = *insert_pt.InsertBefore(std::unique_ptr<BasicBlock>(
        new BasicBlock(std::unique_ptr<Instruction>(new Instruction(
            context_, spv::Op::OpLabel, 0, context_->TakeNextId(), {})))));
    exit.SetParent(function);

    // Redirect in loop predecessors to |exit| block.
    for (uint32_t exit_pred_id : bb_pred) {
      if (loop_->IsInsideLoop(exit_pred_id)) {
        BasicBlock* pred_block = cfg.block(exit_pred_id);
        pred_block->ForEachSuccessorLabel([non_dedicate, &exit](uint32_t* id) {
          if (*id == non_dedicate->id()) *id = exit.id();
        });
        // Update the CFG.
        // |non_dedicate|'s predecessor list will be updated at the end of the
        // loop.
        cfg.RegisterBlock(pred_block);
      }
    }

    // Register the label to the def/use manager, requires for the phi patching.
    def_use_mgr->AnalyzeInstDefUse(exit.GetLabelInst());
    context_->set_instr_block(exit.GetLabelInst(), &exit);

    InstructionBuilder builder(context_, &exit, PreservedAnalyses);
    // Now jump from our dedicate basic block to the old exit.
    // We also reset the insert point so all instructions are inserted before
    // the branch.
    builder.SetInsertPoint(builder.AddBranch(non_dedicate->id()));
    non_dedicate->ForEachPhiInst(
        [&builder, &exit, def_use_mgr, this](Instruction* phi) {
          // New phi operands for this instruction.
          std::vector<uint32_t> new_phi_op;
          // Phi operands for the dedicated exit block.
          std::vector<uint32_t> exit_phi_op;
          for (uint32_t i = 0; i < phi->NumInOperands(); i += 2) {
            uint32_t def_id = phi->GetSingleWordInOperand(i);
            uint32_t incoming_id = phi->GetSingleWordInOperand(i + 1);
            if (loop_->IsInsideLoop(incoming_id)) {
              exit_phi_op.push_back(def_id);
              exit_phi_op.push_back(incoming_id);
            } else {
              new_phi_op.push_back(def_id);
              new_phi_op.push_back(incoming_id);
            }
          }

          // Build the new phi instruction dedicated exit block.
          Instruction* exit_phi = builder.AddPhi(phi->type_id(), exit_phi_op);
          // Build the new incoming branch.
          new_phi_op.push_back(exit_phi->result_id());
          new_phi_op.push_back(exit.id());
          // Rewrite operands.
          uint32_t idx = 0;
          for (; idx < new_phi_op.size(); idx++)
            phi->SetInOperand(idx, {new_phi_op[idx]});
          // Remove extra operands, from last to first (more efficient).
          for (uint32_t j = phi->NumInOperands() - 1; j >= idx; j--)
            phi->RemoveInOperand(j);
          // Update the def/use manager for this |phi|.
          def_use_mgr->AnalyzeInstUse(phi);
        });
    // Update the CFG.
    cfg.RegisterBlock(&exit);
    cfg.RemoveNonExistingEdges(non_dedicate->id());
    new_loop_exits.insert(&exit);
    // If non_dedicate is in a loop, add the new dedicated exit in that loop.
    if (Loop* parent_loop = loop_desc[non_dedicate])
      parent_loop->AddBasicBlock(&exit);
  }

  if (new_loop_exits.size() == 1) {
    loop_->SetMergeBlock(*new_loop_exits.begin());
  }

  if (made_change) {
    context_->InvalidateAnalysesExceptFor(
        PreservedAnalyses | IRContext::kAnalysisCFG |
        IRContext::Analysis::kAnalysisLoopAnalysis);
  }
}